

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCtorsPass.cpp
# Opt level: O3

PreservedAnalyses * __thiscall
InlineCtorsPass::run
          (PreservedAnalyses *__return_storage_ptr__,InlineCtorsPass *this,Function *F,
          FunctionAnalysisManager *FM)

{
  void **ppvVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 *puVar6;
  void *pvVar7;
  uint uVar8;
  ulong *puVar9;
  char cVar10;
  GlobalVariable *Tors;
  GlobalVariable *Tors_00;
  FunctionType *pFVar11;
  ulong uVar12;
  Function *pFVar13;
  Function *pFVar14;
  ulong *puVar15;
  Function *pFVar16;
  ulong *puVar17;
  pair<llvm::Function_*,_unsigned_long> *__i;
  ulong *puVar18;
  Twine *NameStr;
  ulong *puVar19;
  long lVar20;
  long lVar21;
  Function *pFVar22;
  StringRef SVar23;
  StringRef SVar24;
  StringRef SVar25;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Ctors;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Dtors;
  Instruction *in_stack_fffffffffffffec8;
  SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_> local_f8;
  undefined1 local_e8 [64];
  SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_> local_a8;
  undefined1 local_98 [64];
  Twine local_58;
  InlineCtorsPass *this_00;
  
  SVar23.Length = (size_t)"shellvm-main";
  SVar23.Data = (char *)F;
  cVar10 = llvm::Function::hasFnAttribute(SVar23);
  if (cVar10 != '\0') {
    SVar24.Length = (size_t)"llvm.global_ctors";
    SVar24.Data = *(char **)(F + 0x28);
    Tors = (GlobalVariable *)llvm::Module::getGlobalVariable(SVar24,true);
    this_00 = *(InlineCtorsPass **)(F + 0x28);
    SVar25.Length = (size_t)"llvm.global_dtors";
    SVar25.Data = (char *)this_00;
    Tors_00 = (GlobalVariable *)llvm::Module::getGlobalVariable(SVar25,true);
    if (Tors != (GlobalVariable *)0x0 || Tors_00 != (GlobalVariable *)0x0) {
      local_f8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX = local_e8;
      local_f8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Size = 0;
      local_f8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Capacity = 4;
      getFunctions(this_00,Tors,&local_f8);
      local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX = local_98;
      local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Size = 0;
      local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
      super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
      super_SmallVectorBase<unsigned_int>.Capacity = 4;
      getFunctions(this_00,Tors_00,&local_a8);
      pvVar7 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      uVar8 = local_f8.
              super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
              super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
              super_SmallVectorBase<unsigned_int>.Size;
      uVar12 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      if (uVar12 != 0) {
        puVar19 = (ulong *)((long)local_f8.
                                  super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                                  .
                                  super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                                  .super_SmallVectorBase<unsigned_int>.BeginX + uVar12 * 0x10);
        lVar20 = 0x3f;
        if (uVar12 != 0) {
          for (; local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.Size >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<std::pair<llvm::Function*,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                  (local_f8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX,puVar19,
                   ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
        if (uVar8 < 0x11) {
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                    (pvVar7,puVar19);
        }
        else {
          puVar18 = (ulong *)((long)pvVar7 + 0x100);
          std::
          __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>>
                    (pvVar7,puVar18);
          puVar17 = (ulong *)((long)pvVar7 + 0x108);
          do {
            uVar12 = puVar18[-1];
            uVar2 = *puVar18;
            uVar3 = puVar18[1];
            puVar15 = puVar18;
            puVar9 = puVar17;
            if (uVar12 < uVar3) {
              do {
                puVar15 = puVar9;
                puVar15[-1] = puVar15[-3];
                *puVar15 = uVar12;
                puVar9 = puVar15 + -2;
                uVar12 = puVar15[-4];
              } while (puVar15[-4] < uVar3);
              puVar15 = puVar15 + -3;
            }
            *puVar15 = uVar2;
            puVar15[1] = uVar3;
            puVar18 = puVar18 + 2;
            puVar17 = puVar17 + 2;
          } while (puVar18 != puVar19);
        }
        pvVar7 = local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.BeginX;
        uVar8 = local_f8.
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                super_SmallVectorBase<unsigned_int>.Size;
        uVar12 = local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
        if (uVar12 != 0) {
          puVar19 = (ulong *)((long)local_f8.
                                    super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                                    .
                                    super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                                    .super_SmallVectorBase<unsigned_int>.BeginX + uVar12 * 0x10);
          lVar20 = 0x3f;
          if (uVar12 != 0) {
            for (; local_f8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.Size >> lVar20 == 0; lVar20 = lVar20 + -1) {
            }
          }
          std::
          __introsort_loop<std::pair<llvm::Function*,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                    (local_f8.
                     super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                     .
                     super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                     .super_SmallVectorBase<unsigned_int>.BeginX,puVar19,
                     ((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
          if (uVar8 < 0x11) {
            std::
            __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                      (pvVar7,puVar19);
          }
          else {
            puVar18 = (ulong *)((long)pvVar7 + 0x100);
            std::
            __insertion_sort<std::pair<llvm::Function*,unsigned_long>*,__gnu_cxx::__ops::_Iter_comp_iter<InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>>
                      (pvVar7,puVar18);
            puVar17 = (ulong *)((long)pvVar7 + 0x108);
            do {
              uVar12 = puVar18[-1];
              uVar2 = *puVar18;
              uVar3 = puVar18[1];
              puVar15 = puVar18;
              puVar9 = puVar17;
              if (uVar3 < uVar12) {
                do {
                  puVar15 = puVar9;
                  puVar15[-1] = puVar15[-3];
                  *puVar15 = uVar12;
                  puVar9 = puVar15 + -2;
                  uVar12 = puVar15[-4];
                } while (uVar3 < puVar15[-4]);
                puVar15 = puVar15 + -3;
              }
              *puVar15 = uVar2;
              puVar15[1] = uVar3;
              puVar18 = puVar18 + 2;
              puVar17 = puVar17 + 2;
            } while (puVar18 != puVar19);
          }
        }
      }
      pvVar7 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      pFVar22 = *(Function **)(F + 0x50);
      pFVar14 = pFVar22 + -0x18;
      if (pFVar22 == (Function *)0x0) {
        pFVar14 = (Function *)0x0;
      }
      lVar20 = *(long *)(pFVar14 + 0x30);
      while( true ) {
        if (lVar20 == 0) {
          __assert_fail("Val && \"isa<> used on a null pointer\"",
                        "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x5a,
                        "static bool llvm::isa_impl_cl<llvm::AllocaInst, llvm::Instruction *>::doit(const From *) [To = llvm::AllocaInst, From = llvm::Instruction *]"
                       );
        }
        if (*(char *)(lVar20 + -8) != ':') break;
        lVar20 = *(long *)(lVar20 + 8);
      }
      uVar12 = local_f8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff;
      if (uVar12 != 0) {
        lVar21 = 0;
        do {
          pFVar14 = *(Function **)((long)pvVar7 + lVar21);
          if (pFVar14 == (Function *)0x0) {
            pFVar11 = (FunctionType *)0x0;
          }
          else {
            pFVar11 = llvm::Function::getFunctionType(pFVar14);
          }
          llvm::Twine::Twine(&local_58,"");
          auVar4._8_8_ = 0;
          auVar4._0_8_ = &local_58;
          llvm::CallInst::Create
                    ((CallInst *)pFVar11,(FunctionType *)pFVar14,(Value *)0x0,
                     (ArrayRef<llvm::Value_*>)(auVar4 << 0x40),(Twine *)(lVar20 + -0x18),
                     in_stack_fffffffffffffec8);
          lVar21 = lVar21 + 0x10;
        } while (uVar12 << 4 != lVar21);
        pFVar22 = *(Function **)(F + 0x50);
      }
      pFVar14 = F + 0x48;
      puVar6 = (undefined1 *)
               local_a8.
               super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
               super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
               super_SmallVectorBase<unsigned_int>.BeginX;
      if (pFVar22 == pFVar14) {
        pFVar16 = (Function *)0x0;
      }
      else {
        do {
          pFVar13 = pFVar22 + -0x18;
          if (pFVar22 == (Function *)0x0) {
            pFVar13 = (Function *)0x0;
          }
          pFVar16 = *(Function **)(pFVar13 + 0x30);
        } while ((pFVar16 == pFVar13 + 0x28) &&
                (pFVar22 = *(Function **)(pFVar22 + 8), pFVar22 != pFVar14));
      }
      do {
        do {
          local_a8.super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
          super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
          super_SmallVectorBase<unsigned_int>.BeginX = puVar6;
          if (pFVar22 == pFVar14) {
            if (Tors != (GlobalVariable *)0x0) {
              llvm::GlobalVariable::removeFromParent();
            }
            if (Tors_00 != (GlobalVariable *)0x0) {
              llvm::GlobalVariable::removeFromParent();
            }
            (__return_storage_ptr__->PreservedIDs).SmallStorage[1] = (void *)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.SmallArray =
                 (void **)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArray =
                 (void **)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArraySize = 0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumNonEmpty = 0;
            *(undefined8 *)
             &(__return_storage_ptr__->NotPreservedAnalysisIDs).
              super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumTombstones = 0
            ;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[0] = (void *)0x0;
            *(undefined8 *)
             &(__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
              super_SmallPtrSetImplBase.NumTombstones = 0;
            (__return_storage_ptr__->PreservedIDs).SmallStorage[0] = (void *)0x0;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[1] = (void *)0x0;
            ppvVar1 = (__return_storage_ptr__->PreservedIDs).SmallStorage;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.SmallArray = ppvVar1;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.CurArray = ppvVar1;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.CurArraySize = 2;
            (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
            super_SmallPtrSetImplBase.NumNonEmpty = 0;
            ppvVar1 = (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.SmallArray =
                 ppvVar1;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArray = ppvVar1;
            (__return_storage_ptr__->NotPreservedAnalysisIDs).
            super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.CurArraySize = 2;
            if ((undefined1 *)
                local_a8.
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                super_SmallVectorBase<unsigned_int>.BeginX != local_98) {
              free(local_a8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX);
            }
            if ((undefined1 *)
                local_f8.
                super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                super_SmallVectorBase<unsigned_int>.BeginX == local_e8) {
              return __return_storage_ptr__;
            }
            free(local_f8.
                 super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>.
                 super_SmallVectorBase<unsigned_int>.BeginX);
            return __return_storage_ptr__;
          }
          NameStr = (Twine *)(pFVar16 + -0x18);
          if (pFVar16 == (Function *)0x0) {
            NameStr = (Twine *)0x0;
          }
          if (((NameStr->RHS).character == '\x1c') &&
             (uVar12 = local_a8.
                       super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>
                       .
                       super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                       .super_SmallVectorBase<unsigned_int>._8_8_ & 0xffffffff, uVar12 != 0)) {
            lVar20 = 0;
            do {
              pFVar13 = *(Function **)(puVar6 + lVar20);
              if (pFVar13 == (Function *)0x0) {
                pFVar11 = (FunctionType *)0x0;
              }
              else {
                pFVar11 = llvm::Function::getFunctionType(pFVar13);
              }
              llvm::Twine::Twine(&local_58,"");
              auVar5._8_8_ = 0;
              auVar5._0_8_ = &local_58;
              llvm::CallInst::Create
                        ((CallInst *)pFVar11,(FunctionType *)pFVar13,(Value *)0x0,
                         (ArrayRef<llvm::Value_*>)(auVar5 << 0x40),NameStr,in_stack_fffffffffffffec8
                        );
              lVar20 = lVar20 + 0x10;
            } while (uVar12 << 4 != lVar20);
          }
          pFVar16 = *(Function **)(pFVar16 + 8);
          pFVar13 = pFVar22 + -0x18;
          if (pFVar22 == (Function *)0x0) {
            pFVar13 = (Function *)0x0;
          }
          puVar6 = (undefined1 *)
                   local_a8.
                   super_SmallVectorTemplateBase<std::pair<llvm::Function_*,_unsigned_long>,_true>.
                   super_SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   .super_SmallVectorBase<unsigned_int>.BeginX;
        } while (pFVar16 != pFVar13 + 0x28);
        for (pFVar22 = *(Function **)(pFVar22 + 8); pFVar22 != pFVar14;
            pFVar22 = *(Function **)(pFVar22 + 8)) {
          pFVar13 = pFVar22 + -0x18;
          if (pFVar22 == (Function *)0x0) {
            pFVar13 = (Function *)0x0;
          }
          pFVar16 = *(Function **)(pFVar13 + 0x30);
          if (pFVar16 != pFVar13 + 0x28) break;
        }
      } while( true );
    }
  }
  llvm::PreservedAnalyses::all();
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses InlineCtorsPass::run(Function &F,
                                             FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {

    return llvm::PreservedAnalyses::all();
  }

  GlobalVariable *GlobalCtors =
      F.getParent()->getNamedGlobal("llvm.global_ctors");
  GlobalVariable *GlobalDtors =
      F.getParent()->getNamedGlobal("llvm.global_dtors");
  if (!GlobalCtors && !GlobalDtors) {
    return llvm::PreservedAnalyses::all();
  }

  SmallVector<FunctionPair, 4> Ctors;
  getFunctions(GlobalCtors, Ctors);
  SmallVector<FunctionPair, 4> Dtors;
  getFunctions(GlobalDtors, Dtors);

  // Sort constructors in ascending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second > B.second;
            });

  // Sort destructors in descending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second < B.second;
            });

  {
    BasicBlock *BBEntry = &F.getEntryBlock();
    BasicBlock::iterator I = BBEntry->begin();
    // Place calls to constructors after alloca
    while (isa<AllocaInst>(I))
      ++I;

    for (auto &KV : Ctors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Search for ret instructions
  for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
    if (!isa<ReturnInst>(*I)) {
      continue;
    }

    for (auto &KV : Dtors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Delete llvm.global_ctors and llvm.global_dtors to prevent duplicate calls
  if (GlobalCtors)
    GlobalCtors->removeFromParent();
  if (GlobalDtors)
    GlobalDtors->removeFromParent();

  return llvm::PreservedAnalyses::none();
}